

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

uint64_t __thiscall
FIX::double_conversion::ReadUInt64
          (double_conversion *this,Vector<const_char> buffer,int from,int digits_to_read)

{
  char *pcVar1;
  bool local_31;
  int local_2c;
  int digit;
  int i;
  uint64_t result;
  int digits_to_read_local;
  int from_local;
  Vector<const_char> buffer_local;
  
  buffer_local.start_._0_4_ = buffer.start_._0_4_;
  _digit = 0;
  local_2c = buffer.length_;
  _digits_to_read_local = this;
  while( true ) {
    if (buffer.length_ + from <= local_2c) {
      return _digit;
    }
    pcVar1 = Vector<const_char>::operator[]((Vector<const_char> *)&digits_to_read_local,local_2c);
    local_31 = 9 < (int)*pcVar1 - 0x30U;
    if (local_31) break;
    _digit = _digit * 10 + (long)(int)((int)*pcVar1 - 0x30U);
    local_2c = local_2c + 1;
  }
  __assert_fail("0 <= digit && digit <= 9",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                ,0x5f,"uint64_t FIX::double_conversion::ReadUInt64(Vector<const char>, int, int)");
}

Assistant:

static uint64_t ReadUInt64(Vector<const char> buffer,
                           int from,
                           int digits_to_read) {
  uint64_t result = 0;
  for (int i = from; i < from + digits_to_read; ++i) {
    int digit = buffer[i] - '0';
    ASSERT(0 <= digit && digit <= 9);
    result = result * 10 + digit;
  }
  return result;
}